

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetType.cpp
# Opt level: O2

NetType * slang::ast::NetType::fromSyntax(Scope *scope,NetTypeDeclarationSyntax *syntax)

{
  undefined1 *puVar1;
  Compilation *this;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  NetType *this_00;
  SourceLocation local_40;
  string_view local_38;
  
  this = scope->compilation;
  local_38 = parsing::Token::valueText(&syntax->name);
  local_40 = parsing::Token::location(&syntax->name);
  this_00 = BumpAllocator::
            emplace<slang::ast::NetType,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                      (&this->super_BumpAllocator,&local_38,&local_40);
  (this_00->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this_00->super_Symbol,scope,syntax_00);
  (this_00->declaredType).typeOrLink = (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
  puVar1 = &(this_00->declaredType).field_0x3f;
  *puVar1 = *puVar1 & 0x7f;
  return this_00;
}

Assistant:

NetType& NetType::fromSyntax(const Scope& scope, const NetTypeDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<NetType>(syntax.name.valueText(), syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->declaredType.setTypeSyntax(*syntax.type);

    return *result;
}